

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O0

void possibleMovesKings(U64 kBoard,U64 FriendlyPieces,arrayMoveList *possibleMoves)

{
  U64 dl;
  U64 dr;
  U64 d;
  U64 r;
  U64 l;
  U64 ul;
  U64 ur;
  U64 u;
  arrayMoveList *possibleMoves_local;
  U64 FriendlyPieces_local;
  U64 kBoard_local;
  
  constantShiftGenerator(kBoard << 8 & (FriendlyPieces ^ 0xffffffffffffffff),8,possibleMoves);
  constantShiftGenerator
            ((kBoard & 0xfefefefefefefe) << 7 & (FriendlyPieces ^ 0xffffffffffffffff),7,
             possibleMoves);
  constantShiftGenerator
            ((kBoard & 0x7f7f7f7f7f7f7f) << 9 & (FriendlyPieces ^ 0xffffffffffffffff),9,
             possibleMoves);
  constantShiftGenerator
            ((kBoard & 0x7f7f7f7f7f7f7f7f) << 1 & (FriendlyPieces ^ 0xffffffffffffffff),1,
             possibleMoves);
  constantShiftGenerator
            ((kBoard & 0xfefefefefefefefe) >> 1 & (FriendlyPieces ^ 0xffffffffffffffff),-1,
             possibleMoves);
  constantShiftGenerator(kBoard >> 8 & (FriendlyPieces ^ 0xffffffffffffffff),-8,possibleMoves);
  constantShiftGenerator
            ((kBoard & 0xfefefefefefefe00) >> 9 & (FriendlyPieces ^ 0xffffffffffffffff),-9,
             possibleMoves);
  constantShiftGenerator
            ((kBoard & 0x7f7f7f7f7f7f7f00) >> 7 & (FriendlyPieces ^ 0xffffffffffffffff),-7,
             possibleMoves);
  return;
}

Assistant:

void possibleMovesKings(const U64 kBoard, const U64 FriendlyPieces, arrayMoveList& possibleMoves) {
  U64 u = ((kBoard & ~(Rank_8)) << 8) & ~FriendlyPieces;
  constantShiftGenerator(u, 8, possibleMoves);

  U64 ur = ((kBoard & ~(File_H | Rank_8)) << 7) & ~FriendlyPieces;
  constantShiftGenerator(ur, 7, possibleMoves);

  U64 ul = ((kBoard & ~(File_A | Rank_8)) << 9) & ~FriendlyPieces;
  constantShiftGenerator(ul, 9, possibleMoves);

  U64 l = ((kBoard & ~(File_A)) << 1) & ~FriendlyPieces;
  constantShiftGenerator(l, 1, possibleMoves);

  U64 r = ((kBoard & ~(File_H)) >> 1) & ~FriendlyPieces;
  constantShiftGenerator(r, -1, possibleMoves);

  U64 d = ((kBoard & ~(Rank_1)) >> 8) & ~FriendlyPieces;
  constantShiftGenerator(d, -8, possibleMoves);

  U64 dr = ((kBoard & ~(File_H | Rank_1)) >> 9) & ~FriendlyPieces;
  constantShiftGenerator(dr, -9, possibleMoves);

  U64 dl = ((kBoard & ~(File_A | Rank_1)) >> 7) & ~FriendlyPieces;
  constantShiftGenerator(dl, -7, possibleMoves);
}